

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O2

Vector * OrthoLeftKer_VQ(Vector *V,QMatrix *Q)

{
  Real *pRVar1;
  Real *pRVar2;
  LASErrIdType LVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  Vector *pVVar8;
  bool bVar9;
  double dVar10;
  undefined1 auVar11 [16];
  
  V_Lock(V);
  LVar3 = LASResult();
  if (LVar3 == LASOK) {
    pVVar8 = V;
    if ((Q->UnitRightKer == False) && (Q->RightKerCmp == (Real *)0x0)) goto LAB_0010d0d4;
    if (V->Instance == Normal) {
      uVar6 = V->Dim;
      uVar7 = Q->Dim;
      if (uVar6 == uVar7) {
        bVar9 = Q->Symmetry == False;
        pRVar1 = V->Cmp;
        if ((Q->UnitRightKer == False || bVar9) && (Q->UnitLeftKer == False)) {
          pRVar2 = (&Q->RightKerCmp)[(ulong)bVar9 * 2];
          dVar10 = 0.0;
          for (uVar7 = 1; uVar7 <= uVar6; uVar7 = uVar7 + 1) {
            dVar10 = dVar10 + pRVar1[uVar7] * pRVar2[uVar7];
          }
          for (uVar7 = 1; uVar7 <= uVar6; uVar7 = uVar7 + 1) {
            pRVar1[uVar7] = pRVar2[uVar7] * -dVar10 + pRVar1[uVar7];
          }
        }
        else {
          dVar10 = 0.0;
          for (uVar7 = 1; uVar7 <= uVar6; uVar7 = uVar7 + 1) {
            dVar10 = dVar10 + pRVar1[uVar7];
          }
          auVar11._8_4_ = (int)(uVar6 >> 0x20);
          auVar11._0_8_ = uVar6;
          auVar11._12_4_ = 0x45300000;
          for (uVar7 = 1; uVar7 <= uVar6; uVar7 = uVar7 + 1) {
            pRVar1[uVar7] =
                 pRVar1[uVar7] -
                 dVar10 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
          }
        }
        goto LAB_0010d0d4;
      }
    }
    else {
      pcVar4 = V_GetName(V);
      pcVar5 = Q_GetName(Q);
      LASError(LASLValErr,"OrthoLeftKer_VQ",pcVar4,pcVar5,(char *)0x0);
      uVar6 = V->Dim;
      uVar7 = Q->Dim;
    }
    if (uVar6 != uVar7) {
      pcVar4 = V_GetName(V);
      pcVar5 = Q_GetName(Q);
      LASError(LASDimErr,"OrthoLeftKer_VQ",pcVar4,pcVar5,(char *)0x0);
      pVVar8 = (Vector *)0x0;
      goto LAB_0010d0d4;
    }
  }
  pVVar8 = (Vector *)0x0;
LAB_0010d0d4:
  V_Unlock(V);
  return pVVar8;
}

Assistant:

Vector *OrthoLeftKer_VQ(Vector *V, QMatrix *Q)
/* orthogonalize vector V to the "left" null space of matrix Q */
{
    Vector *VRes;

    double Sum, Mean;
    size_t Dim, Ind;
    Real *VCmp, *KerCmp;

    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (Q->UnitRightKer || Q->RightKerCmp != NULL) {
            if (V->Instance == Normal && V->Dim == Q->Dim) {
                Dim = V->Dim;
                VCmp = V->Cmp;
                if (Q->Symmetry)
                    KerCmp = Q->RightKerCmp;
                else
                    KerCmp = Q->LeftKerCmp;
            
                if ((Q->Symmetry && Q->UnitRightKer) || Q->UnitLeftKer) {
                    Sum = 0.0;
                       for_AllCmp 
                        Sum += VCmp[Ind];
                        Mean = Sum / (double)Dim;
                       for_AllCmp 
                        VCmp[Ind] -= Mean;
                } else {
                    Sum = 0.0;
                       for_AllCmp
                        Sum += VCmp[Ind] * KerCmp[Ind];
                       for_AllCmp 
                        VCmp[Ind] -= Sum * KerCmp[Ind];
                    }           
                       
                VRes = V;
            } else {
                if (V->Instance != Normal) 
                    LASError(LASLValErr, "OrthoLeftKer_VQ", V_GetName(V), Q_GetName(Q), NULL);
                if (V->Dim != Q->Dim) 
                    LASError(LASDimErr, "OrthoLeftKer_VQ", V_GetName(V), Q_GetName(Q), NULL);
                VRes = NULL;
            }
        } else {
            VRes = V;
        }
    } else {
        VRes = NULL;
    }

    V_Unlock(V);

    return(VRes);
}